

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O2

void __thiscall FTraceInfo::EnterLinePortal(FTraceInfo *this,FPathTraverse *pt,intercept_t *in)

{
  bool *pbVar1;
  line_t_conflict *src;
  FTraceResults *pFVar2;
  double dVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  sector_t_conflict *psVar7;
  FLinePortal *pFVar8;
  double dVar9;
  double local_88;
  double dStack_80;
  double local_78 [2];
  double local_68;
  undefined8 uStack_60;
  double local_58;
  double dStack_50;
  DVector2 local_48;
  
  src = (in->d).line;
  pFVar8 = linePortals.Array + src->portalindex;
  if (linePortals.Count <= src->portalindex) {
    pFVar8 = (FLinePortal *)0x0;
  }
  dVar3 = in->frac + 1.52587890625e-05;
  dVar9 = in->frac * this->MaxDist;
  local_68 = this->MaxDist * dVar3;
  uStack_60 = 0;
  local_88 = dVar9 * (this->Vec).X + (this->Start).X;
  dStack_80 = dVar9 * (this->Vec).Y + (this->Start).Y;
  dVar9 = (this->Vec).Z * dVar9 + (this->Start).Z;
  local_78[0] = dVar9;
  local_58 = local_88;
  dStack_50 = dStack_80;
  P_TranslatePortalXY(src,(double *)this,&(this->Start).Y);
  P_TranslatePortalZ(src,&(this->Start).Z);
  P_TranslatePortalVXVY(src,&(this->Vec).X,&(this->Vec).Y);
  P_TranslatePortalZ(src,&this->limitz);
  local_48.X = local_68 * (this->Vec).X + (this->Start).X;
  local_48.Y = local_68 * (this->Vec).Y + (this->Start).Y;
  psVar7 = P_PointInSector(&local_48);
  this->CurSector = psVar7;
  this->EnterDist = local_68;
  this->inshootthrough = 1;
  this->startfrac = dVar3;
  pbVar1 = &this->Results->unlinked;
  *pbVar1 = (bool)(*pbVar1 | pFVar8->mType != '\x03');
  FPathTraverse::PortalRelocate(pt,in,this->ptflags,(DVector3 *)0x0);
  if (((this->TraceFlags & 0x10) != 0) &&
     (this->TraceCallback != (_func_ETraceStatus_FTraceResults_ptr_void_ptr *)0x0)) {
    pFVar2 = this->Results;
    pFVar2->HitType = TRACE_CrossingPortal;
    (pFVar2->HitPos).Z = dVar9;
    (pFVar2->HitPos).X = local_58;
    (pFVar2->HitPos).Y = dStack_50;
    P_TranslatePortalXY(src,&local_88,&dStack_80);
    P_TranslatePortalZ(src,local_78);
    pFVar2 = this->Results;
    (pFVar2->SrcFromTarget).Z = local_78[0];
    (pFVar2->SrcFromTarget).X = local_88;
    (pFVar2->SrcFromTarget).Y = dStack_80;
    (pFVar2->HitVector).Z = (this->Vec).Z;
    uVar4 = *(undefined4 *)((long)&(this->Vec).X + 4);
    uVar5 = *(undefined4 *)&(this->Vec).Y;
    uVar6 = *(undefined4 *)((long)&(this->Vec).Y + 4);
    *(undefined4 *)&(pFVar2->HitVector).X = *(undefined4 *)&(this->Vec).X;
    *(undefined4 *)((long)&(pFVar2->HitVector).X + 4) = uVar4;
    *(undefined4 *)&(pFVar2->HitVector).Y = uVar5;
    *(undefined4 *)((long)&(pFVar2->HitVector).Y + 4) = uVar6;
    (*this->TraceCallback)(pFVar2,this->TraceCallbackData);
  }
  return;
}

Assistant:

void FTraceInfo::EnterLinePortal(FPathTraverse &pt, intercept_t *in)
{
	line_t *li = in->d.line;
	FLinePortal *port = li->getPortal();

	double frac = in->frac + EQUAL_EPSILON;
	double enterdist = MaxDist * frac;
	DVector3 exit = Start + MaxDist * in->frac * Vec;

	P_TranslatePortalXY(li, Start.X, Start.Y);
	P_TranslatePortalZ(li, Start.Z);
	P_TranslatePortalVXVY(li, Vec.X, Vec.Y);
	P_TranslatePortalZ(li, limitz);

	CurSector = P_PointInSector(Start + enterdist * Vec);
	EnterDist = enterdist;
	inshootthrough = true;
	startfrac = frac;
	Results->unlinked |= (port->mType != PORTT_LINKED);
	pt.PortalRelocate(in, ptflags);

	if ((TraceFlags & TRACE_ReportPortals) && TraceCallback != NULL)
	{
		enterdist = MaxDist * in->frac;
		Results->HitType = TRACE_CrossingPortal;
		Results->HitPos = exit;
		P_TranslatePortalXY(li, exit.X, exit.Y);
		P_TranslatePortalZ(li, exit.Z);
		Results->SrcFromTarget = exit;
		Results->HitVector = Vec;
		TraceCallback(*Results, TraceCallbackData);
	}
}